

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32_t tag,CodedOutputStream *output)

{
  int iVar1;
  char *pcVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  undefined4 uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  byte bVar8;
  byte *pbVar9;
  int64_t iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *puVar15;
  ulong uVar16;
  uint32_t uVar17;
  pair<unsigned_long,_bool> pVar18;
  string temp;
  string local_50;
  
  if (tag < 8) goto LAB_00179605;
  bVar8 = 0;
  switch(tag & 7) {
  case 0:
    pcVar2 = *(char **)input;
    if ((pcVar2 < *(char **)(input + 8)) && (uVar13 = (ulong)*pcVar2, -1 < (long)uVar13)) {
      *(char **)input = pcVar2 + 1;
      uVar11 = 1;
    }
    else {
      pVar18 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar13 = pVar18.first;
      uVar11 = pVar18._8_4_;
    }
    bVar8 = (byte)uVar11;
    if ((uVar11 & 1) == 0) goto switchD_00179641_caseD_4;
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    uVar17 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar17 | 0x80;
        tag = uVar17 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar7 = 0x3fff < uVar17;
        uVar17 = tag;
      } while (bVar7);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    uVar16 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar9 = (byte)uVar16 | 0x80;
        uVar13 = uVar16 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar7 = 0x3fff < uVar16;
        uVar16 = uVar13;
      } while (bVar7);
    }
    *pbVar9 = (byte)uVar13;
    pbVar9 = pbVar9 + 1;
    break;
  case 1:
    puVar3 = *(undefined8 **)input;
    if (*(int *)(input + 8) - (int)puVar3 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)*puVar3;
      *(undefined8 **)input = puVar3 + 1;
      bVar8 = true;
    }
    if ((bool)bVar8 == false) goto switchD_00179641_caseD_4;
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    _Var6._M_p = local_50._M_dataplus._M_p;
    output->cur_ = pbVar9;
    uVar17 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar17 | 0x80;
        tag = uVar17 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar7 = 0x3fff < uVar17;
        uVar17 = tag;
      } while (bVar7);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *(pointer *)pbVar9 = _Var6._M_p;
    pbVar9 = pbVar9 + 8;
    break;
  case 2:
    pbVar9 = *(byte **)input;
    if (pbVar9 < *(byte **)(input + 8)) {
      bVar8 = *pbVar9;
      uVar17 = (uint32_t)bVar8;
      uVar11 = (uint)bVar8;
      if ((char)bVar8 < '\0') goto LAB_00179873;
      *(byte **)input = pbVar9 + 1;
      bVar7 = true;
    }
    else {
      uVar17 = 0;
LAB_00179873:
      iVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar17);
      uVar11 = (uint)iVar10;
      bVar7 = -1 < iVar10;
    }
    if (bVar7) {
      pbVar9 = output->cur_;
      if ((output->impl_).end_ <= pbVar9) {
        pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
      }
      output->cur_ = pbVar9;
      uVar17 = tag;
      if (0x7f < tag) {
        do {
          *pbVar9 = (byte)uVar17 | 0x80;
          tag = uVar17 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar7 = 0x3fff < uVar17;
          uVar17 = tag;
        } while (bVar7);
      }
      *pbVar9 = (byte)tag;
      pbVar9 = pbVar9 + 1;
      output->cur_ = pbVar9;
      if ((output->impl_).end_ <= pbVar9) {
        pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
      }
      output->cur_ = pbVar9;
      if (uVar11 < 0x80) {
        uVar13 = (ulong)uVar11;
      }
      else {
        uVar13 = (ulong)uVar11;
        do {
          uVar12 = (uint)uVar13;
          *pbVar9 = (byte)uVar13 | 0x80;
          uVar13 = uVar13 >> 7;
          pbVar9 = pbVar9 + 1;
        } while (0x3fff < uVar12);
      }
      *pbVar9 = (byte)uVar13;
      output->cur_ = pbVar9 + 1;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar8 = io::CodedInputStream::ReadString(input,&local_50,uVar11);
      if ((bool)bVar8) {
        puVar15 = output->cur_;
        lVar14 = (long)(int)local_50._M_string_length;
        if ((long)(output->impl_).end_ - (long)puVar15 < lVar14) {
          puVar15 = io::EpsCopyOutputStream::WriteRawFallback
                              (&output->impl_,local_50._M_dataplus._M_p,
                               (int)local_50._M_string_length,puVar15);
        }
        else {
          memcpy(puVar15,local_50._M_dataplus._M_p,local_50._M_string_length & 0xffffffff);
          puVar15 = puVar15 + lVar14;
        }
        output->cur_ = puVar15;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      goto switchD_00179641_caseD_4;
    }
    goto LAB_00179605;
  case 3:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    uVar11 = tag;
    uVar17 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar17 | 0x80;
        pbVar9 = pbVar9 + 1;
        bVar7 = 0x3fff < uVar17;
        uVar11 = uVar17 >> 7;
        uVar17 = uVar17 >> 7;
      } while (bVar7);
    }
    *pbVar9 = (byte)uVar11;
    output->cur_ = pbVar9 + 1;
    iVar1 = *(int *)(input + 0x34);
    *(int *)(input + 0x34) = iVar1 + -1;
    if ((0 < iVar1) && (bVar7 = SkipMessage(input,output), bVar7)) {
      if (*(int *)(input + 0x34) < *(int *)(input + 0x38)) {
        *(int *)(input + 0x34) = *(int *)(input + 0x34) + 1;
      }
      bVar8 = *(uint *)(input + 0x20) == (tag & 0xfffffff8 | 4);
      goto switchD_00179641_caseD_4;
    }
LAB_00179605:
    bVar8 = 0;
  default:
    goto switchD_00179641_caseD_4;
  case 5:
    puVar4 = *(undefined4 **)input;
    if (*(int *)(input + 8) - (int)puVar4 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *puVar4;
      *(undefined4 **)input = puVar4 + 1;
      bVar8 = true;
    }
    if ((bool)bVar8 == false) goto switchD_00179641_caseD_4;
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    uVar17 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar17 | 0x80;
        tag = uVar17 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar7 = 0x3fff < uVar17;
        uVar17 = tag;
      } while (bVar7);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    uVar5 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *(undefined4 *)pbVar9 = uVar5;
    pbVar9 = pbVar9 + 4;
  }
  output->cur_ = pbVar9;
switchD_00179641_caseD_4:
  return (bool)(bVar8 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO: Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}